

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  byte bVar1;
  bool bVar2;
  undefined4 in_EDX;
  string *in_RDI;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  undefined7 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe87;
  string *in_stack_fffffffffffffe88;
  allocator *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  byte in_stack_fffffffffffffe9f;
  string local_148 [39];
  allocator local_121;
  string local_120 [32];
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  undefined4 local_14;
  
  local_14 = in_EDX;
  toLower((string *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  *(undefined4 *)(in_RDI + 0x20) = local_14;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  if (*(int *)(in_RDI + 0x20) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"exclude:",&local_39);
    in_stack_fffffffffffffe9f =
         startsWith((string *)in_stack_fffffffffffffe88,
                    (string *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if ((in_stack_fffffffffffffe9f & 1) == 0) {
      in_stack_fffffffffffffe90 = &local_91;
      in_stack_fffffffffffffe88 = in_RDI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"~",in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe87 =
           startsWith((string *)in_stack_fffffffffffffe88,
                      (string *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      if ((in_stack_fffffffffffffe87 & 1) == 0) {
        *(undefined4 *)(in_RDI + 0x20) = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)local_b8,(ulong)in_RDI);
        std::__cxx11::string::operator=(in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
        *(undefined4 *)(in_RDI + 0x20) = 2;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_70,(ulong)in_RDI);
      std::__cxx11::string::operator=(in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
      *(undefined4 *)(in_RDI + 0x20) = 2;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"*",&local_d9);
  bVar1 = startsWith((string *)in_stack_fffffffffffffe88,
                     (string *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::substr((ulong)local_100,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_100);
    std::__cxx11::string::~string(local_100);
    *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) | 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"*",&local_121);
  bVar2 = endsWith((string *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                   (string *)in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  if (bVar2) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_148,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_148);
    std::__cxx11::string::~string(local_148);
    *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) | 2;
  }
  return;
}

Assistant:

TestCaseFilter( std::string const& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( toLower( testSpec ) ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( startsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( endsWith( m_stringToMatch, "*" ) ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }